

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O2

gravity_closure_t *
gravity_compiler_run
          (gravity_compiler_t *compiler,char *source,size_t len,uint32_t fileid,_Bool is_static,
          _Bool add_debug)

{
  _Bool _Var1;
  void_r *pvVar2;
  gravity_vm *vm;
  gravity_parser_t *parser;
  gnode_t *pgVar3;
  gravity_function_t *pgVar4;
  gravity_closure_t *pgVar5;
  
  if (len != 0 && source != (char *)0x0) {
    if (compiler->ast != (gnode_t *)0x0) {
      gnode_free(compiler->ast);
    }
    if (compiler->objects == (void_r *)0x0) {
      pvVar2 = void_array_create();
      compiler->objects = pvVar2;
    }
    vm = gravity_vm_newmini();
    compiler->vm = vm;
    gravity_vm_setdata(vm,compiler);
    gravity_vm_set_callbacks(compiler->vm,internal_vm_transfer,internal_vm_cleanup);
    gravity_core_register(compiler->vm);
    parser = gravity_parser_create(source,len,fileid,is_static);
    compiler->parser = parser;
    if (parser != (gravity_parser_t *)0x0) {
      pgVar3 = gravity_parser_run(parser,compiler->delegate);
      compiler->ast = pgVar3;
      if (pgVar3 != (gnode_t *)0x0) {
        gravity_parser_free(compiler->parser);
        compiler->parser = (gravity_parser_t *)0x0;
        _Var1 = gravity_semacheck1(compiler->ast,compiler->delegate);
        if (_Var1) {
          _Var1 = gravity_semacheck2(compiler->ast,compiler->delegate);
          if (_Var1) {
            pgVar4 = gravity_codegen(compiler->ast,compiler->delegate,compiler->vm,add_debug);
            if (pgVar4 != (gravity_function_t *)0x0) {
              pgVar4 = gravity_optimizer(pgVar4,add_debug);
              if (pgVar4 != (gravity_function_t *)0x0) {
                pgVar5 = gravity_closure_new(compiler->vm,pgVar4);
                return pgVar5;
              }
            }
          }
        }
      }
      gravity_compiler_reset(compiler,false);
    }
  }
  return (gravity_closure_t *)0x0;
}

Assistant:

gravity_closure_t *gravity_compiler_run (gravity_compiler_t *compiler, const char *source, size_t len, uint32_t fileid, bool is_static, bool add_debug) {
    if ((source == NULL) || (len == 0)) return NULL;

    // CHECK cleanup first
    if (compiler->ast) gnode_free(compiler->ast);
    if (!compiler->objects) compiler->objects = void_array_create();

    // CODEGEN requires a mini vm in order to be able to handle garbage collector
    compiler->vm = gravity_vm_newmini();
    gravity_vm_setdata(compiler->vm, (void *)compiler);
    gravity_vm_set_callbacks(compiler->vm, internal_vm_transfer, internal_vm_cleanup);
    gravity_core_register(compiler->vm);

    // STEP 0: CREATE PARSER
    compiler->parser = gravity_parser_create(source, len, fileid, is_static);
    if (!compiler->parser) return NULL;

    // STEP 1: SYNTAX CHECK
    compiler->ast = gravity_parser_run(compiler->parser, compiler->delegate);
    if (!compiler->ast) goto abort_compilation;
    gravity_parser_free(compiler->parser);
    compiler->parser = NULL;

    // STEP 2a: SEMANTIC CHECK (NON-LOCAL DECLARATIONS)
    bool b1 = gravity_semacheck1(compiler->ast, compiler->delegate);
    if (!b1) goto abort_compilation;

    // STEP 2b: SEMANTIC CHECK (LOCAL DECLARATIONS)
    bool b2 = gravity_semacheck2(compiler->ast, compiler->delegate);
    if (!b2) goto abort_compilation;

    // STEP 3: INTERMEDIATE CODE GENERATION (stack based VM)
	gravity_function_t *f = gravity_codegen(compiler->ast, compiler->delegate, compiler->vm, add_debug);
    if (!f) goto abort_compilation;

    // STEP 4: CODE GENERATION (register based VM)
	f = gravity_optimizer(f, add_debug);
    if (f) return gravity_closure_new(compiler->vm, f);

abort_compilation:
    gravity_compiler_reset(compiler, false);
    return NULL;
}